

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleCompactMapWithNoKey(SingleDocParser *this,EventHandler *eventHandler)

{
  Token *pTVar1;
  Scanner *in_RSI;
  EventHandler *in_stack_000001c8;
  SingleDocParser *in_stack_000001d0;
  value in_stack_ffffffffffffffdc;
  CollectionStack *in_stack_ffffffffffffffe0;
  
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf26ee1);
  CollectionStack::PushCollectionType(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  pTVar1 = Scanner::peek(in_RSI);
  (**(code **)((in_RSI->INPUT).m_input + 0x20))(in_RSI,&pTVar1->mark,0);
  Scanner::pop(in_RSI);
  HandleNode(in_stack_000001d0,in_stack_000001c8);
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf26f47);
  CollectionStack::PopCollectionType((CollectionStack *)in_RSI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void SingleDocParser::HandleCompactMapWithNoKey(EventHandler& eventHandler) {
  m_pCollectionStack->PushCollectionType(CollectionType::CompactMap);

  // null key
  eventHandler.OnNull(m_scanner.peek().mark, NullAnchor);

  // grab value
  m_scanner.pop();
  HandleNode(eventHandler);

  m_pCollectionStack->PopCollectionType(CollectionType::CompactMap);
}